

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O3

bool absl::lts_20250127::time_internal::cctz::time_zone::Impl::LoadTimeZone
               (string *name,time_zone *tz)

{
  Impl *pIVar1;
  bool bVar2;
  int iVar3;
  Impl *pIVar4;
  pthread_mutex_t *__mutex;
  iterator iVar5;
  Impl *pIVar6;
  mapped_type *ppIVar7;
  undefined8 uVar8;
  pointer __p;
  pointer *__ptr;
  unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
  new_impl;
  duration<long,_std::ratio<1L,_1L>_> offset;
  Impl *local_38;
  seconds local_30;
  
  pIVar4 = UTCImpl();
  local_30.__r = 0;
  bVar2 = FixedOffsetFromName(name,&local_30);
  if ((bVar2) && (local_30.__r == 0)) {
    tz->impl_ = pIVar4;
    return true;
  }
  __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    if (((anonymous_namespace)::time_zone_map_abi_cxx11_ !=
         (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)0x0) &&
       (iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((anonymous_namespace)::time_zone_map_abi_cxx11_,name),
       iVar5.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
       ._M_cur != (__node_type *)0x0)) {
      tz->impl_ = *(Impl **)((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                                   ._M_cur + 0x28);
      pIVar6 = *(Impl **)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                                ._M_cur + 0x28);
      pthread_mutex_unlock(__mutex);
      return pIVar6 != pIVar4;
    }
    pthread_mutex_unlock(__mutex);
    pIVar6 = (Impl *)operator_new(0x28);
    Impl(pIVar6,name);
    local_38 = pIVar6;
    __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 == 0) {
      if ((anonymous_namespace)::time_zone_map_abi_cxx11_ ==
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)0x0) {
        (anonymous_namespace)::time_zone_map_abi_cxx11_ =
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)operator_new(0x38);
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_buckets =
             &(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_bucket_count = 1;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin)._M_nxt =
             (_Hash_node_base *)0x0;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_element_count = 0;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_max_load_factor = 1.0
        ;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_next_resize = 0;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket = (__node_base_ptr)0x0;
      }
      ppIVar7 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(anonymous_namespace)::time_zone_map_abi_cxx11_,name);
      pIVar1 = local_38;
      pIVar6 = *ppIVar7;
      if (pIVar6 == (Impl *)0x0) {
        pIVar6 = pIVar4;
        if ((local_38->zone_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneIf>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneIf_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneIf>_>
            .super__Head_base<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneIf_*,_false>.
            _M_head_impl != (TimeZoneIf *)0x0) {
          local_38 = (Impl *)0x0;
          pIVar6 = pIVar1;
        }
        *ppIVar7 = pIVar6;
      }
      tz->impl_ = pIVar6;
      pIVar6 = *ppIVar7;
      pthread_mutex_unlock(__mutex);
      if (local_38 == (Impl *)0x0) {
        return pIVar6 != pIVar4;
      }
      std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>::
      operator()((default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl> *)
                 &local_38,local_38);
      return pIVar6 != pIVar4;
    }
  }
  else {
    iVar3 = std::__throw_system_error(iVar3);
  }
  uVar8 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(__mutex);
  if (local_38 != (Impl *)0x0) {
    std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>::operator()
              ((default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl> *)
               &local_38,local_38);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

bool time_zone::Impl::LoadTimeZone(const std::string& name, time_zone* tz) {
  const Impl* const utc_impl = UTCImpl();

  // Check for UTC (which is never a key in time_zone_map).
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset) && offset == seconds::zero()) {
    *tz = time_zone(utc_impl);
    return true;
  }

  // Check whether the time zone has already been loaded.
  {
    std::lock_guard<std::mutex> lock(TimeZoneMutex());
    if (time_zone_map != nullptr) {
      TimeZoneImplByName::const_iterator itr = time_zone_map->find(name);
      if (itr != time_zone_map->end()) {
        *tz = time_zone(itr->second);
        return itr->second != utc_impl;
      }
    }
  }

  // Load the new time zone (outside the lock).
  std::unique_ptr<const Impl> new_impl(new Impl(name));

  // Add the new time zone to the map.
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map == nullptr) time_zone_map = new TimeZoneImplByName;
  const Impl*& impl = (*time_zone_map)[name];
  if (impl == nullptr) {  // this thread won any load race
    impl = new_impl->zone_ ? new_impl.release() : utc_impl;
  }
  *tz = time_zone(impl);
  return impl != utc_impl;
}